

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

size_t ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  size_t sVar1;
  
  sVar1 = (size_t)g_thread_affinity_mask_all;
  if (sVar1 == 0) {
    g_thread_affinity_mask_all = 1;
    sVar1 = 1;
  }
  return sVar1;
}

Assistant:

size_t get_cpu_thread_affinity_mask(int powersave)
{
    if (g_thread_affinity_mask_all == 0)
    {
        setup_thread_affinity_masks();
    }

    if (g_thread_affinity_mask_little == 0)
    {
        // SMP cpu powersave not supported
        // fallback to all cores anyway
        return g_thread_affinity_mask_all;
    }

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    fprintf(stderr, "powersave %d not supported\n", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}